

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

void __thiscall gui::DefaultTheme::DefaultTheme(DefaultTheme *this,Gui *gui,string *fontFile)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RDI;
  float fVar2;
  Font *in_stack_00000168;
  Theme *in_stack_00000170;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Font *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_58 [8];
  string *in_stack_ffffffffffffffb0;
  Font *in_stack_ffffffffffffffb8;
  __0 local_31;
  _func_void_Font_ptr *local_30;
  
  Theme::Theme((Theme *)in_stack_ffffffffffffff50,
               (Gui *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  *in_RDI = &PTR__DefaultTheme_002f66f8;
  operator_new(0x98);
  sf::Font::Font(in_stack_ffffffffffffff50);
  local_30 = DefaultTheme(gui::Gui_const&,std::__cxx11::string_const&)::$_0::
             operator_cast_to_function_pointer(&local_31);
  std::unique_ptr<sf::Font,void(*)(sf::Font*)>::unique_ptr<void(*)(sf::Font*),void>
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffff50,
             (pointer)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (__enable_if_t<_is_lvalue_reference<void_(*)(Font_*)>::value,_void_(*&&)(sf::Font_*)>)
             0x168ada);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator->
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)0x168ae8);
  bVar1 = sf::Font::loadFromFile(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (!bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff50);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_58);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffff50);
  fVar2 = Theme::computeTextMaxHeightRatio(in_stack_00000170,in_stack_00000168);
  *(float *)(in_RDI + 10) = fVar2;
  return;
}

Assistant:

DefaultTheme::DefaultTheme(const Gui& gui, const std::string& fontFile) :
    Theme(gui),
    font_(new sf::Font(), [](sf::Font* ptr) { delete ptr; }) {

    if (!font_->loadFromFile(fontFile)) {
        throw std::runtime_error("\"" + fontFile + "\": unable to load font file.");
    }
    fontMaxHeightRatio_ = computeTextMaxHeightRatio(*font_);
}